

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
               (ParseNode *pnodeScopeList,ParseNode *pnodeParent,
               ByteCodeGenerator *byteCodeGenerator,ParseNodeVisitor<SymCheck> prefix,
               ParseNodeVisitor<SymCheck> postfix,uint *pIndex,bool breakOnBodyScope)

{
  code *pcVar1;
  anon_class_24_3_9710772a fn;
  anon_class_24_3_9710772a fn_00;
  ParseNodeVisitor<SymCheck> prefix_00;
  ParseNodeVisitor<SymCheck> prefix_01;
  ParseNodeVisitor<SymCheck> prefix_02;
  ParseNodeVisitor<SymCheck> prefix_03;
  ParseNodeVisitor<SymCheck> prefix_04;
  ParseNodeVisitor<SymCheck> prefix_05;
  ParseNodeVisitor<SymCheck> prefix_06;
  ParseNodeVisitor<SymCheck> prefix_07;
  ParseNodeVisitor<SymCheck> prefix_08;
  ParseNode *this;
  ParseableFunctionInfo *pPVar2;
  uint *puVar3;
  bool bVar4;
  charcount_t cVar5;
  charcount_t cVar6;
  uint uVar7;
  uint uVar8;
  BOOL BVar9;
  uint32 uVar10;
  ParseNodeFnc *pPVar11;
  FunctionInfo **ppFVar12;
  FunctionBody *pFVar13;
  ParseNodeBin *pPVar14;
  Scope *pSVar15;
  FunctionInfo *nestedFunc;
  ParseNodeBlock *pPVar16;
  ParseNodePtr pnode_00;
  ParseNodeWith *pPVar17;
  undefined4 *puVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  bool local_211;
  SymCheck *pSStack_210;
  bool isMergedScope_2;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_208;
  ParseNode *local_200;
  SymCheck *local_1f8;
  bool local_1e9;
  SymCheck *pSStack_1e8;
  bool isMergedScope_1;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_1e0;
  ParseNode *local_1d8;
  SymCheck *local_1d0;
  ParseNodeCatch *local_1c8;
  ParseNodeCatch *pnodeCatchScope;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_1b8;
  ParseNode *local_1b0;
  SymCheck *local_1a8;
  bool local_199;
  ParseNodeBlock *pPStack_198;
  bool isMergedScope;
  ParseNodeBlock *pnodeBlockScope;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_188;
  ParseNode *local_180;
  SymCheck *local_178;
  SymCheck *local_170;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_168;
  ParseNode *local_160;
  SymCheck *local_158;
  FunctionInfo *local_150;
  ParseNode *pnode;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_140;
  ParseNode *local_138;
  SymCheck *local_130;
  uint **local_128;
  ParseNode **local_120;
  ParseNodeVisitor<SymCheck> *local_118;
  SymCheck *local_110;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_108;
  ParseNode *local_100;
  SymCheck *local_f8;
  uint **local_f0;
  ParseNode **local_e8;
  ParseNodeVisitor<SymCheck> *local_e0;
  SymCheck *local_d8;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_d0;
  ParseNode *local_c8;
  SymCheck *local_c0;
  ProxyEntryPointInfo *local_b8;
  ParseNodePtr containerScope;
  Scope *bodyScope;
  Scope *paramScope;
  FunctionProxy *proxy_1;
  FuncInfo *funcInfo;
  FunctionInfo *info;
  ParseableFunctionInfo *reuseNestedFunc;
  NestedArray *parentNestedArray;
  FunctionProxy *proxy;
  ParseNodeFnc *pnodeFnc;
  FunctionBody *pLastReuseFunc;
  ParseNodeBlock *pPStack_58;
  uint i;
  ParseNode *pnodeScope;
  ParseableFunctionInfo *parentFunc;
  FuncInfo *parentFuncInfo;
  uint *puStack_38;
  bool breakOnBodyScope_local;
  uint *pIndex_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnodeParent_local;
  ParseNode *pnodeScopeList_local;
  ParseNodeVisitor<SymCheck> prefix_local;
  
  prefix_local.m_context = (SymCheck *)prefix.m_fn;
  pnodeScopeList_local = (ParseNode *)prefix.m_context;
  parentFuncInfo._7_1_ = breakOnBodyScope;
  puStack_38 = pIndex;
  pIndex_local = (uint *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeParent;
  pnodeParent_local = pnodeScopeList;
  pPVar11 = ParseNode::AsParseNodeFnc(pnodeParent);
  parentFunc = (ParseableFunctionInfo *)pPVar11->funcInfo;
  pnodeScope = (ParseNode *)((FuncInfo *)parentFunc)->byteCodeFunction;
  pLastReuseFunc._4_4_ = 0;
  pnodeFnc = *(ParseNodeFnc **)(pIndex_local + 0x72);
  pPStack_58 = (ParseNodeBlock *)pnodeParent_local;
  while( true ) {
    pPVar16 = pPStack_58;
    if (pPStack_58 == (ParseNodeBlock *)0x0) {
      return;
    }
    if (((parentFuncInfo._7_1_ & 1) != 0) &&
       (pPVar11 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local),
       pPVar16 == pPVar11->pnodeBodyScope)) break;
    switch((pPStack_58->super_ParseNodeStmt).super_ParseNode.nop) {
    case knopFncDecl:
      proxy = (FunctionProxy *)ParseNode::AsParseNodeFnc((ParseNode *)pPStack_58);
      if (pnodeFnc != (ParseNodeFnc *)0x0) {
        bVar4 = ByteCodeGenerator::IsInNonDebugMode((ByteCodeGenerator *)pIndex_local);
        if (bVar4) {
          bVar4 = Js::ParseableFunctionInfo::GetIsGlobalFunc((ParseableFunctionInfo *)pnodeScope);
          if (!bVar4) {
            pIndex_local[0x72] = 0;
            pIndex_local[0x73] = 0;
          }
        }
        else {
          bVar4 = Js::ParseableFunctionInfo::GetIsGlobalFunc((ParseableFunctionInfo *)pnodeFnc);
          if (((bVar4) &&
              (bVar4 = Js::ParseableFunctionInfo::GetIsGlobalFunc
                                 ((ParseableFunctionInfo *)pnodeScope), bVar4)) ||
             ((bVar4 = Js::ParseableFunctionInfo::GetIsGlobalFunc((ParseableFunctionInfo *)pnodeFnc)
              , !bVar4 &&
              (bVar4 = Js::ParseableFunctionInfo::GetIsGlobalFunc
                                 ((ParseableFunctionInfo *)pnodeScope), !bVar4)))) {
            cVar5 = Js::ParseableFunctionInfo::StartInDocument((ParseableFunctionInfo *)pnodeFnc);
            if (cVar5 != *(charcount_t *)((long)&byteCodeGenerator_local->scriptContext + 4)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar18 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0xd07,"(pLastReuseFunc->StartInDocument() == pnodeParent->ichMin)"
                                 ,"pLastReuseFunc->StartInDocument() == pnodeParent->ichMin");
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar18 = 0;
            }
            cVar5 = Js::ParseableFunctionInfo::LengthInChars((ParseableFunctionInfo *)pnodeFnc);
            cVar6 = ParseNode::LengthInCodepoints((ParseNode *)byteCodeGenerator_local);
            if (cVar5 != cVar6) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar18 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0xd08,
                                 "(pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints())"
                                 ,
                                 "pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints()"
                                );
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar18 = 0;
            }
            uVar7 = Js::ParseableFunctionInfo::GetNestedCount((ParseableFunctionInfo *)pnodeFnc);
            uVar8 = Js::ParseableFunctionInfo::GetNestedCount((ParseableFunctionInfo *)pnodeScope);
            if (uVar7 != uVar8) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar18 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0xd09,
                                 "(pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount())"
                                 ,"pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount()"
                                );
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar18 = 0;
            }
            parentNestedArray =
                 (NestedArray *)
                 Js::ParseableFunctionInfo::GetNestedFunctionProxy
                           ((ParseableFunctionInfo *)pnodeFnc,*puStack_38);
            if (((FunctionProxy *)parentNestedArray == (FunctionProxy *)0x0) ||
               (bVar4 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)parentNestedArray),
               !bVar4)) {
              pIndex_local[0x72] = 0;
              pIndex_local[0x73] = 0;
            }
            else {
              pFVar13 = Js::FunctionProxy::GetFunctionBody((FunctionProxy *)parentNestedArray);
              *(FunctionBody **)(pIndex_local + 0x72) = pFVar13;
            }
          }
        }
      }
      reuseNestedFunc =
           (ParseableFunctionInfo *)
           Js::ParseableFunctionInfo::GetNestedArray((ParseableFunctionInfo *)pnodeScope);
      info = (FunctionInfo *)0x0;
      if (reuseNestedFunc != (ParseableFunctionInfo *)0x0) {
        if (*(uint *)&(reuseNestedFunc->super_FunctionProxy).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject <= *puStack_38) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar18 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xd23,"(*pIndex < parentNestedArray->nestedCount)",
                             "*pIndex < parentNestedArray->nestedCount");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar18 = 0;
        }
        ppFVar12 = Memory::WriteBarrierPtr::operator_cast_to_FunctionInfo__
                             ((WriteBarrierPtr *)
                              (&(reuseNestedFunc->super_FunctionProxy).auxPtrs + *puStack_38));
        funcInfo = (FuncInfo *)*ppFVar12;
        if ((funcInfo != (FuncInfo *)0x0) &&
           (BVar9 = Js::FunctionInfo::HasParseableInfo((FunctionInfo *)funcInfo), BVar9 != 0)) {
          info = (FunctionInfo *)
                 Js::FunctionInfo::GetParseableFunctionInfo((FunctionInfo *)funcInfo);
          bVar4 = ByteCodeGenerator::IsInNonDebugMode((ByteCodeGenerator *)pIndex_local);
          if ((!bVar4) &&
             ((*(long *)(pIndex_local + 0x72) == 0 &&
              (bVar4 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)info), bVar4)))) {
            pFVar13 = Js::FunctionProxy::GetFunctionBody((FunctionProxy *)info);
            *(FunctionBody **)(pIndex_local + 0x72) = pFVar13;
          }
        }
      }
      PreVisitFunction((ParseNodeFnc *)proxy,(ByteCodeGenerator *)pIndex_local,
                       (ParseableFunctionInfo *)info);
      proxy_1 = (FunctionProxy *)proxy[1].m_utf8SourceInfo.ptr;
      FuncInfo::OnStartVisitFunction((FuncInfo *)parentFunc,(ParseNodeFnc *)proxy);
      if (proxy[1].functionInfo.ptr != (FunctionInfo *)0x0) {
        bVar4 = ByteCodeGenerator::IsInNonDebugMode((ByteCodeGenerator *)pIndex_local);
        if ((((!bVar4) && (pnodeFnc != (ParseNodeFnc *)0x0)) &&
            (*(long *)(pIndex_local + 0x72) == 0)) &&
           ((paramScope = (Scope *)Js::ParseableFunctionInfo::GetNestedFunctionProxy
                                             ((ParseableFunctionInfo *)pnodeFnc,*puStack_38),
            paramScope != (Scope *)0x0 &&
            (bVar4 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)paramScope),
            pSVar15 = paramScope, !bVar4)))) {
          pFVar13 = Js::FunctionProxy::GetFunctionBody
                              (*(FunctionProxy **)&proxy_1[6].m_functionNumber);
          Js::FunctionProxy::UpdateFunctionBodyImpl((FunctionProxy *)pSVar15,pFVar13);
        }
        bodyScope = FuncInfo::GetParamScope((FuncInfo *)proxy_1);
        containerScope = (ParseNodePtr)FuncInfo::GetBodyScope((FuncInfo *)proxy_1);
        BeginVisitBlock((ParseNodeBlock *)(proxy->m_defaultEntryPointInfo).ptr,
                        (ByteCodeGenerator *)pIndex_local);
        pLastReuseFunc._4_4_ = 0;
        local_b8 = (proxy->m_defaultEntryPointInfo).ptr;
        ByteCodeGenerator::PushScope((ByteCodeGenerator *)pIndex_local,bodyScope);
        bVar4 = ParseNodeFnc::HasNonSimpleParameterList((ParseNodeFnc *)proxy);
        uVar19 = SUB84(&postfix,0);
        uVar20 = (undefined4)((ulong)&postfix >> 0x20);
        if ((bVar4) && (bVar4 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)proxy_1), !bVar4)) {
          FuncInfo::SetCurrentChildScope((FuncInfo *)proxy_1,bodyScope);
          if ((*(OpCode *)
                &(local_b8->super_ExpirableObject).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject != knopBlock) ||
             (pPVar16 = ParseNode::AsParseNodeBlock((ParseNode *)local_b8),
             (pPVar16->field_0x5c & 3) != 3)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar18 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xd54,
                               "(containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter)"
                               ,
                               "containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter"
                              );
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar18 = 0;
          }
          pPVar16 = ParseNode::AsParseNodeBlock((ParseNode *)local_b8);
          local_c8 = pnodeScopeList_local;
          local_c0 = prefix_local.m_context;
          local_d8 = postfix.m_context;
          local_d0 = postfix.m_fn;
          prefix_08.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context
          ;
          prefix_08.m_context = (SymCheck *)pnodeScopeList_local;
          VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                    (pPVar16->pnodeScopes,(ParseNode *)proxy,(ByteCodeGenerator *)pIndex_local,
                     prefix_08,postfix,(uint *)((long)&pLastReuseFunc + 4),true);
          local_f0 = &pIndex_local;
          local_e8 = &pnodeScopeList_local;
          fn.prefix = (ParseNodeVisitor<SymCheck> *)local_e8;
          fn.byteCodeGenerator = (ByteCodeGenerator **)local_f0;
          fn.postfix._0_4_ = uVar19;
          fn.postfix._4_4_ = uVar20;
          local_e0 = &postfix;
          MapFormals<VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>(ParseNode*,ParseNode*,ByteCodeGenerator*,ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>,unsigned_int*,bool)::_lambda(ParseNode*)_1_>
                    ((ParseNodeFnc *)proxy,fn);
        }
        ByteCodeGenerator::PushScope((ByteCodeGenerator *)pIndex_local,(Scope *)containerScope);
        FuncInfo::SetCurrentChildScope((FuncInfo *)proxy_1,(Scope *)containerScope);
        PreVisitBlock(*(ParseNodeBlock **)&proxy->m_functionNumber,(ByteCodeGenerator *)pIndex_local
                     );
        AddVarsToScope((ParseNode *)proxy[1].auxPtrs.ptr,(ByteCodeGenerator *)pIndex_local);
        bVar4 = ParseNodeFnc::HasNonSimpleParameterList((ParseNodeFnc *)proxy);
        if ((!bVar4) || (bVar4 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)proxy_1), bVar4)) {
          local_100 = pnodeScopeList_local;
          local_f8 = prefix_local.m_context;
          local_110 = postfix.m_context;
          local_108 = postfix.m_fn;
          prefix_07.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context
          ;
          prefix_07.m_context = (SymCheck *)pnodeScopeList_local;
          VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                    ((ParseNode *)local_b8,(ParseNode *)proxy,(ByteCodeGenerator *)pIndex_local,
                     prefix_07,postfix,(uint *)((long)&pLastReuseFunc + 4),false);
          local_128 = &pIndex_local;
          local_120 = &pnodeScopeList_local;
          fn_00.prefix = (ParseNodeVisitor<SymCheck> *)local_120;
          fn_00.byteCodeGenerator = (ByteCodeGenerator **)local_128;
          fn_00.postfix._0_4_ = uVar19;
          fn_00.postfix._4_4_ = uVar20;
          local_118 = &postfix;
          MapFormals<VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>(ParseNode*,ParseNode*,ByteCodeGenerator*,ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>,unsigned_int*,bool)::_lambda(ParseNode*)_2_>
                    ((ParseNodeFnc *)proxy,fn_00);
        }
        bVar4 = ParseNodeFnc::HasNonSimpleParameterList((ParseNodeFnc *)proxy);
        if (bVar4) {
          ByteCodeGenerator::AssignUndefinedConstRegister((ByteCodeGenerator *)pIndex_local);
          bVar4 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)proxy_1);
          if (!bVar4) {
            if (*(long *)(*(long *)&proxy->m_functionNumber + 0x48) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar18 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0xd6c,"(pnodeFnc->pnodeBodyScope->scope)",
                                 "pnodeFnc->pnodeBodyScope->scope");
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar18 = 0;
            }
            local_138 = pnodeScopeList_local;
            local_130 = prefix_local.m_context;
            pnode = (ParseNode *)postfix.m_context;
            local_140 = postfix.m_fn;
            prefix_06.m_fn =
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)
                 prefix_local.m_context;
            prefix_06.m_context = (SymCheck *)pnodeScopeList_local;
            VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                      (*(ParseNode **)(*(long *)&proxy->m_functionNumber + 0x38),(ParseNode *)proxy,
                       (ByteCodeGenerator *)pIndex_local,prefix_06,postfix,
                       (uint *)((long)&pLastReuseFunc + 4),false);
          }
        }
        BeginVisitBlock(*(ParseNodeBlock **)&proxy->m_functionNumber,
                        (ByteCodeGenerator *)pIndex_local);
        local_150 = proxy[1].functionInfo.ptr;
        while (puVar3 = pIndex_local, *(OpCode *)&local_150->originalEntryPoint == knopList) {
          pPVar14 = ParseNode::AsParseNodeBin((ParseNode *)local_150);
          ByteCodeGenerator::SetCurrentTopStatement((ByteCodeGenerator *)puVar3,pPVar14->pnode1);
          pPVar14 = ParseNode::AsParseNodeBin((ParseNode *)local_150);
          local_160 = pnodeScopeList_local;
          local_158 = prefix_local.m_context;
          local_170 = postfix.m_context;
          local_168 = postfix.m_fn;
          prefix_05.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context
          ;
          prefix_05.m_context = (SymCheck *)pnodeScopeList_local;
          Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                    (pPVar14->pnode1,(ByteCodeGenerator *)pIndex_local,prefix_05,postfix,
                     (ParseNode *)0x0);
          bVar4 = FuncInfo::GetCallsEval((FuncInfo *)proxy_1);
          if (((!bVar4) && (bVar4 = FuncInfo::GetChildCallsEval((FuncInfo *)proxy_1), !bVar4)) &&
             (bVar4 = ByteCodeGenerator::ShouldTrackDebuggerMetadata
                                ((ByteCodeGenerator *)pIndex_local), !bVar4)) {
            pPVar14 = ParseNode::AsParseNodeBin((ParseNode *)local_150);
            MarkInit(pPVar14->pnode1);
          }
          pPVar14 = ParseNode::AsParseNodeBin((ParseNode *)local_150);
          local_150 = (FunctionInfo *)pPVar14->pnode2;
        }
        ByteCodeGenerator::SetCurrentTopStatement
                  ((ByteCodeGenerator *)pIndex_local,(ParseNode *)local_150);
        local_180 = pnodeScopeList_local;
        local_178 = prefix_local.m_context;
        pnodeBlockScope = (ParseNodeBlock *)postfix.m_context;
        local_188 = postfix.m_fn;
        prefix_04.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context;
        prefix_04.m_context = (SymCheck *)pnodeScopeList_local;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  ((ParseNode *)local_150,(ByteCodeGenerator *)pIndex_local,prefix_04,postfix,
                   (ParseNode *)0x0);
        EndVisitBlock(*(ParseNodeBlock **)&proxy->m_functionNumber,(ByteCodeGenerator *)pIndex_local
                     );
        EndVisitBlock((ParseNodeBlock *)(proxy->m_defaultEntryPointInfo).ptr,
                      (ByteCodeGenerator *)pIndex_local);
      }
      puVar3 = pIndex_local;
      if (proxy[1].functionInfo.ptr == (FunctionInfo *)0x0) {
        pSVar15 = FuncInfo::GetParamScope((FuncInfo *)proxy_1);
        ByteCodeGenerator::PushScope((ByteCodeGenerator *)puVar3,pSVar15);
        puVar3 = pIndex_local;
        pSVar15 = FuncInfo::GetBodyScope((FuncInfo *)proxy_1);
        ByteCodeGenerator::PushScope((ByteCodeGenerator *)puVar3,pSVar15);
      }
      pPVar2 = parentFunc;
      uVar10 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)pIndex_local);
      bVar4 = FuncInfo::IsFakeGlobalFunction((FuncInfo *)pPVar2,uVar10);
      this = pnodeScope;
      if (!bVar4) {
        *(uint *)((long)&proxy[1].undeferredFunctionType.ptr + 4) = *puStack_38;
        nestedFunc = Js::FunctionProxy::GetFunctionInfo
                               (*(FunctionProxy **)&proxy_1[6].m_functionNumber);
        uVar7 = *puStack_38;
        *puStack_38 = uVar7 + 1;
        uVar10 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)pIndex_local);
        Js::ParseableFunctionInfo::SetNestedFunc
                  ((ParseableFunctionInfo *)this,nestedFunc,uVar7,uVar10);
      }
      if (pnodeScope == (ParseNode *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xd99,"(parentFunc)","parentFunc");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 0;
      }
      FuncInfo::OnEndVisitFunction((FuncInfo *)parentFunc,(ParseNodeFnc *)proxy);
      PostVisitFunction((ParseNodeFnc *)proxy,(ByteCodeGenerator *)pIndex_local);
      pPStack_58 = (ParseNodeBlock *)(proxy->functionInfo).ptr;
      *(ParseNodeFnc **)(pIndex_local + 0x72) = pnodeFnc;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar18 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xdd5,"(false)","Unexpected opcode in tree of scopes");
      if (bVar4) {
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar18 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    case knopBlock:
      pPStack_198 = ParseNode::AsParseNodeBlock((ParseNode *)pPStack_58);
      PreVisitBlock(pPStack_198,(ByteCodeGenerator *)pIndex_local);
      FuncInfo::OnStartVisitScope((FuncInfo *)parentFunc,pPStack_198->scope,&local_199);
      local_1b0 = pnodeScopeList_local;
      local_1a8 = prefix_local.m_context;
      pnodeCatchScope = (ParseNodeCatch *)postfix.m_context;
      local_1b8 = postfix.m_fn;
      prefix_03.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context;
      prefix_03.m_context = (SymCheck *)pnodeScopeList_local;
      VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPStack_198->pnodeScopes,(ParseNode *)byteCodeGenerator_local,
                 (ByteCodeGenerator *)pIndex_local,prefix_03,postfix,puStack_38,false);
      FuncInfo::OnEndVisitScope((FuncInfo *)parentFunc,pPStack_198->scope,(bool)(local_199 & 1));
      PostVisitBlock(pPStack_198,(ByteCodeGenerator *)pIndex_local);
      pPVar16 = ParseNode::AsParseNodeBlock((ParseNode *)pPStack_58);
      pPStack_58 = (ParseNodeBlock *)pPVar16->pnodeNext;
      break;
    case knopWith:
      PreVisitWith((ParseNode *)pPStack_58,(ByteCodeGenerator *)pIndex_local);
      pPVar2 = parentFunc;
      pPVar17 = ParseNode::AsParseNodeWith((ParseNode *)pPStack_58);
      FuncInfo::OnStartVisitScope((FuncInfo *)pPVar2,pPVar17->scope,&local_211);
      pPVar17 = ParseNode::AsParseNodeWith((ParseNode *)pPStack_58);
      prefix_00.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context;
      prefix_00.m_context = (SymCheck *)pnodeScopeList_local;
      VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar17->pnodeScopes,(ParseNode *)byteCodeGenerator_local,
                 (ByteCodeGenerator *)pIndex_local,prefix_00,postfix,puStack_38,false);
      pPVar2 = parentFunc;
      pPVar17 = ParseNode::AsParseNodeWith((ParseNode *)pPStack_58);
      FuncInfo::OnEndVisitScope((FuncInfo *)pPVar2,pPVar17->scope,(bool)(local_211 & 1));
      PostVisitWith((ParseNode *)pPStack_58,(ByteCodeGenerator *)pIndex_local);
      pPVar17 = ParseNode::AsParseNodeWith((ParseNode *)pPStack_58);
      pPStack_58 = (ParseNodeBlock *)pPVar17->pnodeNext;
      break;
    case knopCatch:
      local_1c8 = ParseNode::AsParseNodeCatch((ParseNode *)pPStack_58);
      PreVisitCatch(local_1c8,(ByteCodeGenerator *)pIndex_local);
      bVar4 = ParseNodeCatch::HasParam(local_1c8);
      if ((bVar4) && (bVar4 = ParseNodeCatch::HasPatternParam(local_1c8), !bVar4)) {
        pnode_00 = ParseNodeCatch::GetParam(local_1c8);
        local_1d8 = pnodeScopeList_local;
        local_1d0 = prefix_local.m_context;
        pSStack_1e8 = postfix.m_context;
        local_1e0 = postfix.m_fn;
        prefix_02.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context;
        prefix_02.m_context = (SymCheck *)pnodeScopeList_local;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pnode_00,(ByteCodeGenerator *)pIndex_local,prefix_02,postfix,(ParseNode *)0x0);
      }
      FuncInfo::OnStartVisitScope((FuncInfo *)parentFunc,local_1c8->scope,&local_1e9);
      local_200 = pnodeScopeList_local;
      local_1f8 = prefix_local.m_context;
      pSStack_210 = postfix.m_context;
      local_208 = postfix.m_fn;
      prefix_01.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)prefix_local.m_context;
      prefix_01.m_context = (SymCheck *)pnodeScopeList_local;
      VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (local_1c8->pnodeScopes,(ParseNode *)byteCodeGenerator_local,
                 (ByteCodeGenerator *)pIndex_local,prefix_01,postfix,puStack_38,false);
      FuncInfo::OnEndVisitScope((FuncInfo *)parentFunc,local_1c8->scope,(bool)(local_1e9 & 1));
      PostVisitCatch((ParseNode *)local_1c8,(ByteCodeGenerator *)pIndex_local);
      pPStack_58 = (ParseNodeBlock *)local_1c8->pnodeNext;
    }
  }
  return;
}

Assistant:

void VisitNestedScopes(ParseNode* pnodeScopeList, ParseNode* pnodeParent, ByteCodeGenerator* byteCodeGenerator,
    PrefixFn prefix, PostfixFn postfix, uint *pIndex, bool breakOnBodyScope = false)
{
    // Visit all scopes nested in this scope before visiting this function's statements. This way we have all the
    // attributes of all the inner functions before we assign registers within this function.
    // All the attributes we need to propagate downward should already be recorded by the parser.
    // - call to "eval()"
    // - nested in "with"
    FuncInfo * parentFuncInfo = pnodeParent->AsParseNodeFnc()->funcInfo;
    Js::ParseableFunctionInfo* parentFunc = parentFuncInfo->byteCodeFunction;
    ParseNode* pnodeScope;
    uint i = 0;

    // Cache to restore it back once we come out of current function.
    Js::FunctionBody * pLastReuseFunc = byteCodeGenerator->pCurrentFunction;

    for (pnodeScope = pnodeScopeList; pnodeScope;)
    {
        if (breakOnBodyScope && pnodeScope == pnodeParent->AsParseNodeFnc()->pnodeBodyScope)
        {
            break;
        }

        switch (pnodeScope->nop)
        {
        case knopFncDecl:
        {
            ParseNodeFnc * pnodeFnc = pnodeScope->AsParseNodeFnc();
            if (pLastReuseFunc)
            {
                if (!byteCodeGenerator->IsInNonDebugMode())
                {
                    // Here we are trying to match the inner sub-tree as well with already created inner function.

                    if ((pLastReuseFunc->GetIsGlobalFunc() && parentFunc->GetIsGlobalFunc())
                        || (!pLastReuseFunc->GetIsGlobalFunc() && !parentFunc->GetIsGlobalFunc()))
                    {
                        Assert(pLastReuseFunc->StartInDocument() == pnodeParent->ichMin);
                        Assert(pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints());
                        Assert(pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount());

                        // If the current function is not parsed yet, its function body is not generated yet.
                        // Reset pCurrentFunction to null so that it will not be able re-use anything.
                        Js::FunctionProxy* proxy = pLastReuseFunc->GetNestedFunctionProxy((*pIndex));
                        if (proxy && proxy->IsFunctionBody())
                        {
                            byteCodeGenerator->pCurrentFunction = proxy->GetFunctionBody();
                        }
                        else
                        {
                            byteCodeGenerator->pCurrentFunction = nullptr;
                        }
                    }
                }
                else if (!parentFunc->GetIsGlobalFunc())
                {
                    // In the deferred parsing mode, we will be reusing the only one function (which is asked when on ::Begin) all inner function will be created.
                    byteCodeGenerator->pCurrentFunction = nullptr;
                }
            }

            Js::ParseableFunctionInfo::NestedArray * parentNestedArray = parentFunc->GetNestedArray();
            Js::ParseableFunctionInfo* reuseNestedFunc = nullptr;
            if (parentNestedArray)
            {
                Assert(*pIndex < parentNestedArray->nestedCount);
                Js::FunctionInfo * info = parentNestedArray->functionInfoArray[*pIndex];
                if (info && info->HasParseableInfo())
                {
                    reuseNestedFunc = info->GetParseableFunctionInfo();

                    // If parentFunc was redeferred, try to set pCurrentFunction to this FunctionBody,
                    // and cleanup to reparse (as previous cleanup stops at redeferred parentFunc).
                    if (!byteCodeGenerator->IsInNonDebugMode()
                        && !byteCodeGenerator->pCurrentFunction
                        && reuseNestedFunc->IsFunctionBody())
                    {
                        byteCodeGenerator->pCurrentFunction = reuseNestedFunc->GetFunctionBody();
                    }
                }
            }
            PreVisitFunction(pnodeFnc, byteCodeGenerator, reuseNestedFunc);
            FuncInfo *funcInfo = pnodeFnc->funcInfo;

            parentFuncInfo->OnStartVisitFunction(pnodeFnc);

            if (pnodeFnc->pnodeBody)
            {
                if (!byteCodeGenerator->IsInNonDebugMode() && pLastReuseFunc != nullptr && byteCodeGenerator->pCurrentFunction == nullptr)
                {
                    // Patch current non-parsed function's FunctionBodyImpl with the new generated function body.
                    // So that the function object (pointing to the old function body) can able to get to the new one.

                    Js::FunctionProxy* proxy = pLastReuseFunc->GetNestedFunctionProxy((*pIndex));
                    if (proxy && !proxy->IsFunctionBody())
                    {
                        proxy->UpdateFunctionBodyImpl(funcInfo->byteCodeFunction->GetFunctionBody());
                    }
                }

                Scope *paramScope = funcInfo->GetParamScope();
                Scope *bodyScope = funcInfo->GetBodyScope();

                BeginVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
                i = 0;
                ParseNodePtr containerScope = pnodeFnc->pnodeScopes;

                // Push the param scope
                byteCodeGenerator->PushScope(paramScope);

                if (pnodeFnc->HasNonSimpleParameterList() && !funcInfo->IsBodyAndParamScopeMerged())
                {
                    // Set param scope as the current child scope.
                    funcInfo->SetCurrentChildScope(paramScope);
                    Assert(containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter);
                    VisitNestedScopes(containerScope->AsParseNodeBlock()->pnodeScopes, pnodeFnc, byteCodeGenerator, prefix, postfix, &i, true);
                    MapFormals(pnodeFnc, [&](ParseNode *argNode) { Visit(argNode, byteCodeGenerator, prefix, postfix); });
                }

                // Push the body scope
                byteCodeGenerator->PushScope(bodyScope);
                funcInfo->SetCurrentChildScope(bodyScope);

                PreVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
                AddVarsToScope(pnodeFnc->pnodeVars, byteCodeGenerator);

                if (!pnodeFnc->HasNonSimpleParameterList() || funcInfo->IsBodyAndParamScopeMerged())
                {
                    VisitNestedScopes(containerScope, pnodeFnc, byteCodeGenerator, prefix, postfix, &i);
                    MapFormals(pnodeFnc, [&](ParseNode *argNode) { Visit(argNode, byteCodeGenerator, prefix, postfix); });
                }

                if (pnodeFnc->HasNonSimpleParameterList())
                {
                    byteCodeGenerator->AssignUndefinedConstRegister();

                    if (!funcInfo->IsBodyAndParamScopeMerged())
                    {
                        Assert(pnodeFnc->pnodeBodyScope->scope);
                        VisitNestedScopes(pnodeFnc->pnodeBodyScope->pnodeScopes, pnodeFnc, byteCodeGenerator, prefix, postfix, &i);
                    }
                }

                BeginVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);

                ParseNode* pnode = pnodeFnc->pnodeBody;
                while (pnode->nop == knopList)
                {
                    // Check to see whether initializations of locals to "undef" can be skipped.
                    // The logic to do this is cheap - omit the init if we see an init with a value
                    // on the RHS at the top statement level (i.e., not inside a block, try, loop, etc.)
                    // before we see a use. The motivation is to help identify single-def locals in the BE.
                    // Note that this can't be done for globals.
                    byteCodeGenerator->SetCurrentTopStatement(pnode->AsParseNodeBin()->pnode1);
                    Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
                    if (!funcInfo->GetCallsEval() && !funcInfo->GetChildCallsEval() &&
                        // So that it will not be marked as init thus it will be added to the diagnostics symbols container.
                        !(byteCodeGenerator->ShouldTrackDebuggerMetadata()))
                    {
                        MarkInit(pnode->AsParseNodeBin()->pnode1);
                    }
                    pnode = pnode->AsParseNodeBin()->pnode2;
                }
                byteCodeGenerator->SetCurrentTopStatement(pnode);
                Visit(pnode, byteCodeGenerator, prefix, postfix);

                EndVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
                EndVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
            }

            if (!pnodeFnc->pnodeBody)
            {
                // For defer prase scenario push the scopes here
                byteCodeGenerator->PushScope(funcInfo->GetParamScope());
                byteCodeGenerator->PushScope(funcInfo->GetBodyScope());
            }

            if (!parentFuncInfo->IsFakeGlobalFunction(byteCodeGenerator->GetFlags()))
            {
                pnodeFnc->nestedIndex = *pIndex;
                parentFunc->SetNestedFunc(funcInfo->byteCodeFunction->GetFunctionInfo(), (*pIndex)++, byteCodeGenerator->GetFlags());
            }

            Assert(parentFunc);

            parentFuncInfo->OnEndVisitFunction(pnodeFnc);

            PostVisitFunction(pnodeFnc, byteCodeGenerator);

            pnodeScope = pnodeFnc->pnodeNext;

            byteCodeGenerator->pCurrentFunction = pLastReuseFunc;
            break;
        }

        case knopBlock:
        {
            ParseNodeBlock * pnodeBlockScope = pnodeScope->AsParseNodeBlock();
            PreVisitBlock(pnodeBlockScope, byteCodeGenerator);
            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeBlockScope->scope, &isMergedScope);
            VisitNestedScopes(pnodeBlockScope->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);
            parentFuncInfo->OnEndVisitScope(pnodeBlockScope->scope, isMergedScope);
            PostVisitBlock(pnodeBlockScope, byteCodeGenerator);

            pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
            break;
        }

        case knopCatch:
        {
            ParseNodeCatch * pnodeCatchScope = pnodeScope->AsParseNodeCatch();
            PreVisitCatch(pnodeCatchScope, byteCodeGenerator);

            if (pnodeCatchScope->HasParam() && !pnodeCatchScope->HasPatternParam())
            {
                Visit(pnodeCatchScope->GetParam(), byteCodeGenerator, prefix, postfix);
            }

            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeCatchScope->scope, &isMergedScope);
            VisitNestedScopes(pnodeCatchScope->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);

            parentFuncInfo->OnEndVisitScope(pnodeCatchScope->scope, isMergedScope);
            PostVisitCatch(pnodeCatchScope, byteCodeGenerator);

            pnodeScope = pnodeCatchScope->pnodeNext;
            break;
        }

        case knopWith:
        {
            PreVisitWith(pnodeScope, byteCodeGenerator);
            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeScope->AsParseNodeWith()->scope, &isMergedScope);
            VisitNestedScopes(pnodeScope->AsParseNodeWith()->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);
            parentFuncInfo->OnEndVisitScope(pnodeScope->AsParseNodeWith()->scope, isMergedScope);
            PostVisitWith(pnodeScope, byteCodeGenerator);
            pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
            break;
        }

        default:
            AssertMsg(false, "Unexpected opcode in tree of scopes");
            return;
        }
    }
}